

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment.hpp
# Opt level: O1

void pstore::repo::fragment::
     check_range_is_sorted<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
               (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                first,pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                      last)

{
  __normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  _Var1;
  __normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  _Var2;
  
  _Var2._M_current =
       (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
        *)last.it_._M_current;
  if (first.it_._M_current != last.it_._M_current) {
    _Var1._M_current =
         (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          *)((long)first.it_._M_current + 8);
    do {
      _Var2._M_current = _Var1._M_current;
      if ((__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
           )_Var2._M_current == last.it_._M_current) break;
      _Var1._M_current = _Var2._M_current + 1;
    } while ((_Var2._M_current[-1]._M_t.
              super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
              ._M_t.
              super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
              .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>.
             _M_head_impl)->kind_ <=
             (((_Var2._M_current)->_M_t).
              super___uniq_ptr_impl<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
              ._M_t.
              super__Tuple_impl<0UL,_pstore::repo::section_creation_dispatcher_*,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
              .super__Head_base<0UL,_pstore::repo::section_creation_dispatcher_*,_false>.
             _M_head_impl)->kind_);
  }
  if ((__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
       )_Var2._M_current == last.it_._M_current) {
    return;
  }
  assert_failed("std::is_sorted (first, last, [] (value_type const & a, value_type const & b) { section_kind const akind = a.kind (); section_kind const bkind = b.kind (); using utype = std::underlying_type<section_kind>::type; return static_cast<utype> (akind) < static_cast<utype> (bkind); })"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/fragment.hpp"
                ,0x1c2);
}

Assistant:

void fragment::check_range_is_sorted (Iterator first, Iterator last) {
            (void) first;
            (void) last;
#ifndef NDEBUG
            using value_type = typename std::iterator_traits<Iterator>::value_type;
            PSTORE_ASSERT (
                std::is_sorted (first, last, [] (value_type const & a, value_type const & b) {
                    section_kind const akind = a.kind ();
                    section_kind const bkind = b.kind ();
                    using utype = std::underlying_type<section_kind>::type;
                    return static_cast<utype> (akind) < static_cast<utype> (bkind);
                }));
#endif
        }